

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcePack.cpp
# Opt level: O3

Mesh * __thiscall ResourcePack::get_mesh(ResourcePack *this,string *name)

{
  const_iterator cVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Mesh>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Mesh>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Mesh>_>_>
          ::find(&(this->meshes)._M_t,name);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->meshes)._M_t._M_impl.super__Rb_tree_header) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Mesh,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Mesh>_>_>
             ::operator[](&this->meshes,name);
    return pmVar2;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"mesh not loaded ");
  poVar3 = std::operator<<(poVar3,(string *)name);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

Mesh * ResourcePack::get_mesh(std::string& name) {
    if (meshes.count(name)) {
        return &meshes[name];
    }
    else {
        std::cout << "mesh not loaded " << name << std::endl;
        exit(1);
    }
}